

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::LabelTests_SAMTForwardApplyComma_Test::TestBody
          (LabelTests_SAMTForwardApplyComma_Test *this)

{
  char *message;
  string_view line;
  AssertHelper local_d0;
  string_view local_c8;
  AssertionResult gtest_ar;
  _Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> local_a8;
  _Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> local_88;
  SAMTLabeler local_68;
  
  line._M_str = "(ROOT foo (, bar))";
  line._M_len = 0x12;
  readTree((Tree *)&local_a8,line);
  local_68.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
  local_68.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.key_.label._M_dataplus._M_p = (pointer)&local_68.key_.label.field_2;
  local_68.super_Labeler._vptr_Labeler = (_func_int **)&PTR_operator___0015bd08;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_68.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_68.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_68._52_8_ = 0;
  local_68.key_.label._M_string_length = 0;
  local_68.key_.label.field_2._M_local_buf[0] = '\0';
  std::_Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~_Vector_base(&local_88);
  local_c8 = SAMTLabeler::operator()(&local_68,(SpanPair)0x1000000000000);
  testing::internal::CmpHelperEQ<char[11],std::basic_string_view<char,std::char_traits<char>>>
            ((internal *)&gtest_ar,"\"ROOT/COMMA\"","sl(SpanPair{{}, { 0, 1 }})",
             (char (*) [11])"ROOT/COMMA",&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x77,message);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  SAMTLabeler::~SAMTLabeler(&local_68);
  std::_Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

TEST(LabelTests, SAMTForwardApplyComma) {
  auto t = readTree("(ROOT foo (, bar))");
  SAMTLabeler sl(std::move(t));
  EXPECT_EQ("ROOT/COMMA", sl(SpanPair{{}, { 0, 1 }}));
}